

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

void __thiscall CLI::App::App(App *this,string *description_)

{
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)description_);
  App(this,&local_30,(App *)0x0);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::string((string *)&local_50,"-h,--help",&local_71);
  ::std::__cxx11::string::string((string *)&local_70,"Print this help message and exit",&local_72);
  set_help_flag(this,&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

App(std::string description_ = "") : App(description_, nullptr) {
        set_help_flag("-h,--help", "Print this help message and exit");
    }